

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::processDisconnect(CoreBroker *this)

{
  bool in_SIL;
  
  processDisconnect((CoreBroker *)&this[-1].delayTransmitQueue.queueEmptyFlag,in_SIL);
  return;
}

Assistant:

void CoreBroker::processDisconnect(bool skipUnregister)
{
    auto cBrokerState = getBrokerState();
    if (cBrokerState >= BrokerState::TERMINATING) {
        return;
    }
    if (cBrokerState > BrokerState::CONFIGURED) {
        LOG_CONNECTIONS(parent_broker_id, getIdentifier(), "||disconnecting");
        setBrokerState(BrokerState::TERMINATING);
        brokerDisconnect();
    }
    setBrokerState(BrokerState::TERMINATED);

    if (!skipUnregister) {
        unregister();
    }
    disconnection.trigger();
}